

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O1

int64_t __thiscall
disruptor::BlockingStrategy::WaitFor<long,std::ratio<1l,1l>>
          (BlockingStrategy *this,int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted,duration<long,_std::ratio<1L,_1L>_> *timeout)

{
  long lVar1;
  pointer ppSVar2;
  char cVar3;
  undefined8 uVar4;
  pointer ppSVar5;
  long lVar6;
  long unaff_R12;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *__range1;
  BlockingStrategy *local_68;
  rep rStack_60;
  code *local_58;
  code *pcStack_50;
  unique_lock<std::mutex> local_48;
  Sequence *local_38;
  
  rStack_60 = timeout->__r;
  pcStack_50 = std::
               _Function_handler<bool_(std::unique_lock<std::mutex>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:327:20)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(std::unique_lock<std::mutex>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:327:20)>
             ::_M_manager;
  lVar6 = (cursor->sequence_).super___atomic_base<long>._M_i;
  local_68 = this;
  local_38 = cursor;
  if (lVar6 < *sequence) {
    local_48._M_owns = false;
    local_48._M_device = &this->mutex_;
    std::unique_lock<std::mutex>::lock(&local_48);
    local_48._M_owns = true;
    do {
      lVar6 = (local_38->sequence_).super___atomic_base<long>._M_i;
      lVar1 = *sequence;
      if (lVar1 <= lVar6) goto LAB_00114f25;
      if (((alerted->_M_base)._M_i & 1U) != 0) {
        unaff_R12 = -2;
        goto LAB_00114f25;
      }
      if (local_58 == (code *)0x0) {
        uVar4 = std::__throw_bad_function_call();
        if (local_58 != (code *)0x0) {
          (*local_58)(&local_68,&local_68,3);
        }
        _Unwind_Resume(uVar4);
      }
      cVar3 = (*pcStack_50)(&local_68,&local_48);
    } while (cVar3 == '\0');
    unaff_R12 = -3;
LAB_00114f25:
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    if (lVar6 < lVar1) goto LAB_00114f86;
  }
  unaff_R12 = lVar6;
  if ((dependents->super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (dependents->super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    do {
      ppSVar5 = (dependents->
                super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppSVar2 = (dependents->
                super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      unaff_R12 = 0x7fffffffffffffff;
      if (ppSVar5 != ppSVar2) {
        unaff_R12 = 0x7fffffffffffffff;
        do {
          lVar6 = ((*ppSVar5)->sequence_).super___atomic_base<long>._M_i;
          if (lVar6 <= unaff_R12) {
            unaff_R12 = lVar6;
          }
          ppSVar5 = ppSVar5 + 1;
        } while (ppSVar5 != ppSVar2);
      }
      if (*sequence <= unaff_R12) goto LAB_00114f86;
    } while (((alerted->_M_base)._M_i & 1U) == 0);
    unaff_R12 = -2;
  }
LAB_00114f86:
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  return unaff_R12;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted,
                  const std::chrono::duration<Rep, Period>& timeout) {
    return WaitFor(sequence, cursor, dependents, alerted,
                   [this, timeout](Lock& lock) {
                     return std::cv_status::timeout ==
                            consumer_notify_condition_.wait_for(
                                lock, std::chrono::microseconds(timeout));
                   });
  }